

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall kj::Array<const_capnp::PipelineOp>::~Array(Array<const_capnp::PipelineOp> *this)

{
  PipelineOp *pPVar1;
  size_t sVar2;
  
  pPVar1 = this->ptr;
  if (pPVar1 != (PipelineOp *)0x0) {
    sVar2 = this->size_;
    this->ptr = (PipelineOp *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)(this->disposer,pPVar1,8,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }